

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall nv::FloatImage::sampleLinearClamp(FloatImage *this,float x,float y,int c)

{
  uint *puVar1;
  float fVar2;
  float fVar3;
  float f0;
  float f1_00;
  float i2;
  float i1;
  float f4;
  float f3;
  float f2;
  float f1;
  int local_64;
  uint local_60;
  int local_5c;
  int iy1;
  int local_54;
  uint local_50;
  int local_4c;
  int ix1;
  int local_44;
  uint local_40;
  int local_3c;
  int iy0;
  int local_34;
  uint local_30;
  float local_2c;
  int ix0;
  float fracY;
  float fracX;
  int h;
  int w;
  int c_local;
  float y_local;
  float x_local;
  FloatImage *this_local;
  
  fracX = (float)(uint)this->m_width;
  fracY = (float)(uint)this->m_height;
  c_local = (int)((float)(int)fracX * x);
  w = (int)((float)(int)fracY * y);
  h = c;
  _y_local = this;
  ix0 = (int)anon_unknown.dwarf_46676e::frac((float)c_local);
  local_2c = anon_unknown.dwarf_46676e::frac((float)w);
  local_34 = anon_unknown.dwarf_46676e::ifloor((float)c_local);
  iy0 = 0;
  local_3c = (int)fracX + -1;
  puVar1 = (uint *)clamp<int>(&local_34,&iy0,&local_3c);
  local_30 = *puVar1;
  local_44 = anon_unknown.dwarf_46676e::ifloor((float)w);
  ix1 = 0;
  local_4c = (int)fracY + -1;
  puVar1 = (uint *)clamp<int>(&local_44,&ix1,&local_4c);
  local_40 = *puVar1;
  local_54 = anon_unknown.dwarf_46676e::ifloor((float)c_local);
  local_54 = local_54 + 1;
  iy1 = 0;
  local_5c = (int)fracX + -1;
  puVar1 = (uint *)clamp<int>(&local_54,&iy1,&local_5c);
  local_50 = *puVar1;
  local_64 = anon_unknown.dwarf_46676e::ifloor((float)w);
  local_64 = local_64 + 1;
  f1 = 0.0;
  f2 = (float)((int)fracY + -1);
  puVar1 = (uint *)clamp<int>(&local_64,(int *)&f1,(int *)&f2);
  local_60 = *puVar1;
  fVar2 = pixel(this,local_30,local_40,h);
  fVar3 = pixel(this,local_50,local_40,h);
  f0 = pixel(this,local_30,local_60,h);
  f1_00 = pixel(this,local_50,local_60,h);
  fVar2 = lerp(fVar2,fVar3,(float)ix0);
  fVar3 = lerp(f0,f1_00,(float)ix0);
  fVar2 = lerp(fVar2,fVar3,local_2c);
  return fVar2;
}

Assistant:

float FloatImage::sampleLinearClamp(float x, float y, const int c) const
{
	const int w = m_width;
	const int h = m_height;
	
	x *= w;
	y *= h;
	
	const float fracX = frac(x);
	const float fracY = frac(y);
	
	const int ix0 = ::clamp(ifloor(x), 0, w-1);
	const int iy0 = ::clamp(ifloor(y), 0, h-1);
	const int ix1 = ::clamp(ifloor(x)+1, 0, w-1);
	const int iy1 = ::clamp(ifloor(y)+1, 0, h-1);

	float f1 = pixel(ix0, iy0, c);
	float f2 = pixel(ix1, iy0, c);
	float f3 = pixel(ix0, iy1, c);
	float f4 = pixel(ix1, iy1, c);
	
	float i1 = lerp(f1, f2, fracX);
	float i2 = lerp(f3, f4, fracX);

	return lerp(i1, i2, fracY);
}